

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

int64_t tar_atol_base_n(char *p,size_t char_cnt,wchar_t base)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  long lVar6;
  wchar_t wVar7;
  long lVar8;
  byte *pbVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  
  uVar12 = CONCAT44(0,base);
  iVar10 = 0x7fffffffffffffff;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
  lVar5 = SUB168(auVar3 / auVar2,0);
  lVar6 = SUB168(auVar3 % auVar2,0);
  if (char_cnt == 0) {
    return 0;
  }
  uVar13 = 0;
  while ((bVar1 = p[uVar13], bVar1 == 9 || (bVar1 == 0x20))) {
    uVar13 = uVar13 + 1;
    if (char_cnt == uVar13) {
      return 0;
    }
  }
  if (bVar1 == 0x2d) {
    if (char_cnt - 1 == uVar13) {
      return 0;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    auVar2 = auVar3 << 0x40 | ZEXT816(0x8000000000000000);
    lVar6 = SUB168(auVar2 % SEXT816((long)uVar12),0);
    uVar11 = ~uVar13;
    lVar5 = -SUB168(auVar2 / SEXT816((long)uVar12),0);
    pbVar9 = (byte *)(p + uVar13 + 1);
    bVar1 = *pbVar9;
    iVar10 = -0x8000000000000000;
    bVar4 = true;
  }
  else {
    uVar11 = -uVar13;
    pbVar9 = (byte *)(p + uVar13);
    bVar4 = false;
  }
  if ((char)bVar1 < '0') {
    lVar8 = 0;
  }
  else {
    lVar14 = 0;
    lVar8 = 0;
    do {
      wVar7 = (uint)bVar1 + L'\xffffffd0';
      if ((base <= wVar7) || (uVar11 + char_cnt == lVar14)) break;
      if (lVar5 < lVar8) {
        return iVar10;
      }
      if ((lVar8 == lVar5) && (lVar6 < (long)(ulong)(uint)wVar7)) {
        return iVar10;
      }
      lVar8 = lVar8 * uVar12 + (ulong)(uint)wVar7;
      bVar1 = pbVar9[lVar14 + 1];
      lVar14 = lVar14 + 1;
    } while ('/' < (char)bVar1);
  }
  lVar5 = -lVar8;
  if (!bVar4) {
    lVar5 = lVar8;
  }
  return lVar5;
}

Assistant:

static int64_t
tar_atol_base_n(const char *p, size_t char_cnt, int base)
{
	int64_t	l, maxval, limit, last_digit_limit;
	int digit, sign;

	maxval = INT64_MAX;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/* the pointer will not be dereferenced if char_cnt is zero
	 * due to the way the && operator is evaulated.
	 */
	while (char_cnt != 0 && (*p == ' ' || *p == '\t')) {
		p++;
		char_cnt--;
	}

	sign = 1;
	if (char_cnt != 0 && *p == '-') {
		sign = -1;
		p++;
		char_cnt--;

		maxval = INT64_MIN;
		limit = -(INT64_MIN / base);
		last_digit_limit = INT64_MIN % base;
	}

	l = 0;
	if (char_cnt != 0) {
		digit = *p - '0';
		while (digit >= 0 && digit < base  && char_cnt != 0) {
			if (l>limit || (l == limit && digit > last_digit_limit)) {
				return maxval; /* Truncate on overflow. */
			}
			l = (l * base) + digit;
			digit = *++p - '0';
			char_cnt--;
		}
	}
	return (sign < 0) ? -l : l;
}